

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall
QMdiSubWindow::contextMenuEvent(QMdiSubWindow *this,QContextMenuEvent *contextMenuEvent)

{
  long lVar1;
  char cVar2;
  QMenu *this_00;
  long in_FS_OFFSET;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if (((*(long *)(lVar1 + 0x308) == 0) || (*(int *)(*(long *)(lVar1 + 0x308) + 4) == 0)) ||
     (this_00 = *(QMenu **)(lVar1 + 0x310), this_00 == (QMenu *)0x0)) {
LAB_004524f7:
    contextMenuEvent[0xc] = (QContextMenuEvent)0x0;
  }
  else {
    if (*(int *)(lVar1 + 0x2f0) != 1) {
      QMdiSubWindowPrivate::getRegion
                ((QMdiSubWindowPrivate *)&stack0xffffffffffffffd0,(Operation)lVar1);
      cVar2 = QRegion::contains((QPoint *)&stack0xffffffffffffffd0);
      QRegion::~QRegion((QRegion *)&stack0xffffffffffffffd0);
      if (cVar2 == '\0') goto LAB_004524f7;
      this_00 = *(QMenu **)(lVar1 + 0x310);
    }
    QMenu::exec(this_00,(QPoint *)(contextMenuEvent + 0x30),(QAction *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::contextMenuEvent(QContextMenuEvent *contextMenuEvent)
{
    Q_D(QMdiSubWindow);
    if (!d->systemMenu) {
        contextMenuEvent->ignore();
        return;
    }

    if (d->hoveredSubControl == QStyle::SC_TitleBarSysMenu
            || d->getRegion(QMdiSubWindowPrivate::Move).contains(contextMenuEvent->pos())) {
        d->systemMenu->exec(contextMenuEvent->globalPos());
    } else {
        contextMenuEvent->ignore();
    }
}